

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::handlePrint(Executor *this,FunctionCallNode *node)

{
  long *plVar1;
  Value *pVVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  mapped_type *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  StringValueAnalyser analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  undefined1 local_48 [48];
  bool local_18;
  
  iVar3 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar1 = *(long **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10);
  (**(code **)(*plVar1 + 0x10))(plVar1,this);
  pVVar2 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  if (pVVar2->valueType_ != String) {
    __rhs = std::__detail::
            _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&TypeNameStrings_abi_cxx11_,&pVVar2->valueType_);
    std::operator+(&bStack_68,"Function print expected string, but got ",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &bStack_68,"!");
    reportError((string *)local_48,(Node *)node);
  }
  local_48._0_8_ = &PTR__StringValueAnalyser_001d12c8;
  local_48[8] = false;
  local_18 = false;
  (*pVVar2->_vptr_Value[3])(pVVar2);
  if (local_18 != false) {
    std::__cxx11::string::string((string *)&bStack_68,(string *)(local_48 + 0x10));
    poVar4 = std::operator<<((ostream *)&this->stdout_,(string *)&bStack_68);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&bStack_68);
    StringValueAnalyser::~StringValueAnalyser((StringValueAnalyser *)local_48);
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::handlePrint(const FunctionCallNode& node)
{
  const auto& args = node.getArguments();
  (*args.begin())->accept(*this);

  if(value_->getType() != TypeName::String)
    reportError("Function print expected string, but got " +
      TypeNameStrings.at(value_->getType()) + "!", node);

  StringValueAnalyser analyser{};
  value_->accept(analyser);

  const auto str = analyser.getValue().value();
  stdout_ << str << "\n";
}